

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O2

int mapSnow16(Layer *l,int *out,int x,int z,int w,int h)

{
  uint64_t ss;
  undefined1 auVar1 [16];
  int iVar2;
  long lVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  
  iVar2 = (*l->p->getMap)(l->p,out,x + -1,z + -1,w + 2,h + 2);
  if (iVar2 == 0) {
    lVar3 = (long)w;
    lVar6 = 0;
    if (0 < lVar3) {
      lVar6 = lVar3;
    }
    ss = l->startSeed;
    if (h < 1) {
      h = 0;
    }
    piVar8 = out + lVar3 + 3;
    uVar5 = 0;
    while (uVar5 != (uint)h) {
      for (lVar7 = 0; lVar6 != lVar7; lVar7 = lVar7 + 1) {
        if (piVar8[lVar7] == 0) {
          iVar2 = 0;
        }
        else {
          uVar4 = getChunkSeed(ss,x + (int)lVar7,(int)uVar5 + z);
          auVar1._8_8_ = (long)uVar4 >> 0x3f;
          auVar1._0_8_ = (long)uVar4 >> 0x18;
          iVar2 = 1;
          if (SUB168(auVar1 % SEXT816(5),0) == 0) {
            iVar2 = 0xc;
          }
        }
        out[lVar7] = iVar2;
      }
      out = out + lVar3;
      piVar8 = piVar8 + lVar3 + 2;
      uVar5 = uVar5 + 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mapSnow16(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    uint64_t ss = l->startSeed;
    uint64_t cs;

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int v11 = out[i+1 + (j+1)*pW];
            if (v11 != ocean)
            {
                cs = getChunkSeed(ss, i+x, j+z);
                v11 = mcFirstIsZero(cs, 5) ? snowy_tundra : plains;
            }
            out[i + j*w] = v11;
        }
    }

    return 0;
}